

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void tcu::opt::parseIntList(char *src,vector<int,_std::allocator<int>_> *dst)

{
  bool bVar1;
  istream *piVar2;
  char *src_00;
  int local_1f4;
  string local_1f0 [4];
  int intVal;
  string val;
  allocator<char> local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream str;
  vector<int,_std::allocator<int>_> *dst_local;
  char *src_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,src,&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::string(local_1f0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_198,local_1f0,',');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    local_1f4 = 0;
    src_00 = (char *)std::__cxx11::string::c_str();
    de::cmdline::parseType<int>(src_00,&local_1f4);
    std::vector<int,_std::allocator<int>_>::push_back(dst,&local_1f4);
  }
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

static void parseIntList (const char* src, std::vector<int>* dst)
{
	std::istringstream	str	(src);
	std::string			val;

	while (std::getline(str, val, ','))
	{
		int intVal = 0;
		de::cmdline::parseType(val.c_str(), &intVal);
		dst->push_back(intVal);
	}
}